

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHuf.cpp
# Opt level: O0

void anon_unknown.dwarf_108296::compressUncompressSubset(unsigned_short *raw,int n)

{
  ushort *puVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  unsigned_short *puVar6;
  int in_ESI;
  long in_RDI;
  int i;
  int nCompressed;
  int length;
  int minLength;
  int maxLength;
  int offset;
  int maxOffset;
  Array<unsigned_short> uncompressed;
  Array<char> compressed;
  long in_stack_ffffffffffffff28;
  Array<unsigned_short> *in_stack_ffffffffffffff30;
  int local_58;
  int local_50;
  int local_4c;
  int local_44;
  int local_40;
  Array local_30 [16];
  Array local_20 [20];
  int local_c;
  long local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  Imf_3_2::Array<char>::Array((Array<char> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  Imf_3_2::Array<unsigned_short>::Array(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  local_40 = 0x10;
  if (local_c < 0x11) {
    local_40 = local_c + -1;
  }
  local_44 = 1;
  do {
    if (local_40 <= local_44) {
      Imf_3_2::Array<unsigned_short>::~Array(in_stack_ffffffffffffff30);
      Imf_3_2::Array<char>::~Array((Array<char> *)in_stack_ffffffffffffff30);
      return;
    }
    iVar2 = local_c - local_44;
    local_4c = iVar2 + -0x10;
    if (local_4c < 1) {
      local_4c = 1;
    }
    for (local_50 = local_4c; local_50 <= iVar2; local_50 = local_50 + 1) {
      poVar4 = std::operator<<((ostream *)&std::cout,"compressing ");
      std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
      puVar1 = (ushort *)(local_8 + (long)local_44 * 2);
      pcVar5 = Imf_3_2::Array::operator_cast_to_char_(local_20);
      iVar3 = Imf_3_2::hufCompress(puVar1,local_50,pcVar5 + local_44);
      poVar4 = std::operator<<((ostream *)&std::cout,"uncompressing ");
      std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
      pcVar5 = Imf_3_2::Array::operator_cast_to_char_(local_20);
      puVar6 = Imf_3_2::Array::operator_cast_to_unsigned_short_(local_30);
      Imf_3_2::hufUncompress(pcVar5 + local_44,iVar3,puVar6 + local_44,local_50);
      for (local_58 = 0; local_58 < local_50; local_58 = local_58 + 1) {
        puVar6 = Imf_3_2::Array::operator_cast_to_unsigned_short_(local_30);
        if (puVar6[local_44 + local_58] !=
            *(unsigned_short *)(local_8 + (long)(local_44 + local_58) * 2)) {
          __assert_fail("uncompressed[offset + i] == raw[offset + i]",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testHuf.cpp"
                        ,0x8b,
                        "void (anonymous namespace)::compressUncompressSubset(const unsigned short *, int)"
                       );
        }
      }
      poVar4 = (ostream *)std::ostream::operator<<(&std::cout,(long)local_50 * 2);
      poVar4 = std::operator<<(poVar4," bytes, compressed ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      std::operator<<(poVar4," bytes ");
      poVar4 = std::operator<<((ostream *)&std::cout,"(+");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_44);
      poVar4 = std::operator<<(poVar4,",-");
      in_stack_ffffffffffffff30 =
           (Array<unsigned_short> *)std::ostream::operator<<(poVar4,(local_c - local_44) - local_50)
      ;
      poVar4 = std::operator<<((ostream *)in_stack_ffffffffffffff30,")");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

void
compressUncompressSubset (const unsigned short raw[], int n)
{
    // Test various subsets of the data set

    Array<char>           compressed (3 * n + 4 * 65536);
    Array<unsigned short> uncompressed (n);

    int maxOffset = 16;
    if (n <= maxOffset) { maxOffset = n - 1; }

    for (int offset = 1; offset < maxOffset; ++offset)
    {

        int maxLength = n - offset;
        int minLength = maxLength - 16;
        if (minLength < 1) minLength = 1;

        for (int length = minLength; length <= maxLength; ++length)
        {
            cout << "compressing " << flush;

            int nCompressed =
                hufCompress (raw + offset, length, compressed + offset);

            cout << "uncompressing " << flush;

            hufUncompress (
                compressed + offset,
                nCompressed,
                uncompressed + offset,
                length);

            for (int i = 0; i < length; ++i)
                assert (uncompressed[offset + i] == raw[offset + i]);

            cout << sizeof (raw[0]) * length << " bytes, compressed "
                 << nCompressed << " bytes ";
            cout << "(+" << offset << ",-" << n - offset - length << ")"
                 << endl;
        }
    }
}